

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computer.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
indk::Computer::doCompareCPFunction
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CP,
          vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CPf)

{
  iterator __position;
  undefined8 in_RAX;
  ulong uVar1;
  size_type sVar2;
  ulong __n;
  float fVar3;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (long)(CP->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(CP->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  __n = (long)(CPf->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>)._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(CPf->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>)._M_impl
              .super__Vector_impl_data._M_start >> 3;
  if (uVar1 <= __n) {
    __n = uVar1;
  }
  uStack_38 = in_RAX;
  std::vector<float,_std::allocator<float>_>::reserve(__return_storage_ptr__,__n);
  if (0 < (long)__n) {
    sVar2 = 0;
    do {
      fVar3 = Position::getDistance
                        ((CP->
                         super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[sVar2],
                         (CPf->
                         super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[sVar2]);
      uStack_38 = CONCAT44(fVar3,(undefined4)uStack_38);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (__return_storage_ptr__,__position,(float *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = fVar3;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      sVar2 = sVar2 + 1;
    } while (__n != sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> indk::Computer::doCompareCPFunction(std::vector<indk::Position*> CP, std::vector<indk::Position*> CPf) {
    std::vector<float> R;
    int64_t L = CP.size();
    if (CPf.size() < L) L = CPf.size();
    R.reserve(L);
    for (long long i = 0; i < L; i++) R.push_back(indk::Position::getDistance(CP[i], CPf[i]));
    return R;
}